

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O2

void skynet_mq_release(message_queue *q,message_drop drop_func,void *ud)

{
  int iVar1;
  skynet_message sStack_38;
  
  spinlock_lock(&q->lock);
  if (q->release == 0) {
    skynet_globalmq_push(q);
    (q->lock).lock = 0;
  }
  else {
    (q->lock).lock = 0;
    while( true ) {
      iVar1 = skynet_mq_pop(q,&sStack_38);
      if (iVar1 != 0) break;
      (*drop_func)(&sStack_38,ud);
    }
    if (q->next != (message_queue *)0x0) {
      __assert_fail("q->next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                    ,100,"void _release(struct message_queue *)");
    }
    free(q->queue);
    free(q);
  }
  return;
}

Assistant:

static void 
_release(struct message_queue *q) {
	assert(q->next == NULL);
	SPIN_DESTROY(q)
	skynet_free(q->queue);
	skynet_free(q);
}